

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O2

Data * __thiscall Bracket::eval(Bracket *this,Runtime *runtime)

{
  string *__lhs;
  _List_node_base *p_Var1;
  long *plVar2;
  pointer ppDVar3;
  bool bVar4;
  vector<Data_*,_std::allocator<Data_*>_> *pvVar5;
  Data *pDVar6;
  tms *__buffer;
  _Vector_base<Data_*,_std::allocator<Data_*>_> *this_00;
  Data *data;
  long lVar7;
  _Self __tmp;
  ulong uVar8;
  _List_node_base *p_Var9;
  
  Runtime::pushVarEnv(runtime);
  __lhs = &this->func;
  bVar4 = std::operator==(__lhs,"+");
  if (bVar4) {
    pvVar5 = genParaData(this,runtime);
    pDVar6 = Data::plus(pvVar5);
  }
  else {
    bVar4 = std::operator==(__lhs,"-");
    if (bVar4) {
      pvVar5 = genParaData(this,runtime);
      pDVar6 = Data::minus(pvVar5);
    }
    else {
      bVar4 = std::operator==(__lhs,"*");
      if (bVar4) {
        __buffer = (tms *)genParaData(this,runtime);
        pDVar6 = (Data *)Data::times(__buffer);
      }
      else {
        bVar4 = std::operator==(__lhs,">");
        if (bVar4) {
          pvVar5 = genParaData(this,runtime);
          pDVar6 = Data::bigger(pvVar5);
        }
        else {
          bVar4 = std::operator==(__lhs,"<");
          if (bVar4) {
            pvVar5 = genParaData(this,runtime);
            pDVar6 = Data::smaller(pvVar5);
          }
          else {
            bVar4 = std::operator==(__lhs,"/");
            if (bVar4) {
              pvVar5 = genParaData(this,runtime);
              pDVar6 = Data::divide(pvVar5);
            }
            else {
              bVar4 = std::operator==(__lhs,"%");
              if (bVar4) {
                pvVar5 = genParaData(this,runtime);
                pDVar6 = Data::mod(pvVar5);
              }
              else {
                bVar4 = std::operator==(__lhs,"=");
                if (bVar4) {
                  pvVar5 = genParaData(this,runtime);
                  pDVar6 = Data::equal(pvVar5);
                }
                else {
                  bVar4 = std::operator==(__lhs,"set");
                  if (bVar4) {
                    p_Var9 = (this->para).super__List_base<Atom_*,_std::allocator<Atom_*>_>._M_impl.
                             _M_node.super__List_node_base._M_next;
                    p_Var1 = p_Var9[1]._M_next;
                    plVar2 = (long *)p_Var9->_M_next[1]._M_next;
                    pDVar6 = (Data *)(**(code **)(*plVar2 + 0x18))(plVar2,runtime);
                    Runtime::setVar(runtime,(string *)&p_Var1->_M_prev,pDVar6);
                    pDVar6 = Data::trueData;
                  }
                  else {
                    bVar4 = std::operator==(__lhs,"echo");
                    if (bVar4) {
                      p_Var9 = (this->para).super__List_base<Atom_*,_std::allocator<Atom_*>_>.
                               _M_impl._M_node.super__List_node_base._M_next[1]._M_next;
                      pDVar6 = (Data *)(**(code **)((long)p_Var9->_M_next + 0x18))(p_Var9,runtime);
                    }
                    else {
                      bVar4 = std::operator==(__lhs,"assign");
                      if (bVar4) {
                        p_Var9 = (this->para).super__List_base<Atom_*,_std::allocator<Atom_*>_>.
                                 _M_impl._M_node.super__List_node_base._M_next;
                        p_Var1 = p_Var9[1]._M_next;
                        plVar2 = (long *)p_Var9->_M_next[1]._M_next;
                        pDVar6 = (Data *)(**(code **)(*plVar2 + 0x18))(plVar2,runtime);
                        Runtime::assignVar(runtime,(string *)&p_Var1->_M_prev,pDVar6);
                        pDVar6 = Data::trueData;
                      }
                      else {
                        bVar4 = std::operator==(__lhs,"begin");
                        if (bVar4) {
                          this_00 = &genParaData(this,runtime)->
                                     super__Vector_base<Data_*,_std::allocator<Data_*>_>;
                          uVar8 = 0;
                          while( true ) {
                            ppDVar3 = (this_00->_M_impl).super__Vector_impl_data._M_start;
                            lVar7 = (long)(this_00->_M_impl).super__Vector_impl_data._M_finish -
                                    (long)ppDVar3 >> 3;
                            if (lVar7 - 1U <= uVar8) break;
                            Data::check(ppDVar3[uVar8]);
                            uVar8 = uVar8 + 1;
                          }
                          pDVar6 = ppDVar3[lVar7 + -1];
                          std::_Vector_base<Data_*,_std::allocator<Data_*>_>::~_Vector_base(this_00)
                          ;
                          operator_delete(this_00);
                        }
                        else {
                          bVar4 = std::operator==(__lhs,"print");
                          if (bVar4) {
                            pvVar5 = genParaData(this,runtime);
                            pDVar6 = Data::print(pvVar5);
                          }
                          else {
                            bVar4 = std::operator==(__lhs,"display");
                            if (bVar4) {
                              pvVar5 = genParaData(this,runtime);
                              pDVar6 = Data::display(pvVar5);
                            }
                            else {
                              bVar4 = std::operator==(__lhs,"if");
                              if (bVar4) {
                                p_Var9 = (this->para).
                                         super__List_base<Atom_*,_std::allocator<Atom_*>_>._M_impl.
                                         _M_node.super__List_node_base._M_next;
                                data = (Data *)(**(code **)((long)(p_Var9[1]._M_next)->_M_next +
                                                           0x18))(p_Var9[1]._M_next,runtime);
                                lVar7 = __dynamic_cast(data,&Data::typeinfo,&Bool::typeinfo,0);
                                if (*(char *)(lVar7 + 0xc) == '\0') {
                                  p_Var9 = p_Var9->_M_next;
                                }
                                plVar2 = (long *)p_Var9->_M_next[1]._M_next;
                                pDVar6 = (Data *)(**(code **)(*plVar2 + 0x18))(plVar2,runtime);
                                Data::check(data);
                              }
                              else {
                                bVar4 = std::operator==(__lhs,"function");
                                if (bVar4) {
                                  Function::newFunction(&this->para);
                                  pDVar6 = Data::trueData;
                                }
                                else {
                                  bVar4 = std::operator==(__lhs,"runtime");
                                  if (bVar4) {
                                    Runtime::display(runtime);
                                    pDVar6 = Data::trueData;
                                  }
                                  else {
                                    pvVar5 = genParaData(this,runtime);
                                    pDVar6 = Function::call(__lhs,pvVar5);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  Runtime::popVarEnv(runtime);
  return pDVar6;
}

Assistant:

Data *Bracket::eval(Runtime *runtime) {
    runtime->pushVarEnv();
    Data *result;
    if (func == "+") {
        result = Data::plus(genParaData(runtime));
    } else if (func == "-") {
        result = Data::minus(genParaData(runtime));
    } else if (func == "*") {
        result = Data::times(genParaData(runtime));
    } else if (func == ">") {
        result = Data::bigger(genParaData(runtime));
    } else if (func == "<") {
        result = Data::smaller(genParaData(runtime));
    } else if (func == "/") {
        result = Data::divide(genParaData(runtime));
    } else if (func == "%") {
        result = Data::mod(genParaData(runtime));
    } else if (func == "=") {
        result = Data::equal(genParaData(runtime));
    } else if (func == "set") {
        runtime->setVar(((Symbol *) (*para.begin()))->name,
                        (*(++para.begin()))->eval(runtime));
        result = Data::trueData;
    } else if (func == "echo") {
        result = (*para.begin())->eval(runtime);
    } else if (func == "assign") {
        runtime->assignVar(((Symbol *) (*para.begin()))->name,
                           (*(++para.begin()))->eval(runtime));
        result = Data::trueData;
    } else if (func == "begin") {
        auto temp = genParaData(runtime);
        for (auto i = 0; i < temp->size() - 1; i++) {
            Data::check((*temp)[i]);
        }
        result = (*temp)[temp->size()-1];
        delete temp;
    } else if (func == "print") {
        result = Data::print(genParaData(runtime));
    } else if (func == "display") {
        result = Data::display(genParaData(runtime)); 
    } else if (func == "if") {
        auto cursor = para.begin();
        auto temp = (*cursor)->eval(runtime);
        Bool *judge = dynamic_cast<Bool *>(temp);
        if (judge->value) {
            cursor++;
        } else {
            cursor++;
            cursor++;
        }
        result = (*cursor)->eval(runtime);
        Data::check(temp);
    } else if (func == "function") {
        Function::newFunction(&para);
        result = Data::trueData;
    } else if (func == "runtime") {
        runtime->display();
        result = Data::trueData;
    } else {
        result = Function::call(func, genParaData(runtime));
    }
    runtime->popVarEnv();
    return result;
}